

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void __thiscall
gguf_kv::gguf_kv<unsigned_char>
          (gguf_kv *this,string *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  value_type vVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *this_00;
  uchar tmp;
  size_t i;
  ulong local_30;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  in_RDI[0x20] = (string)0x1;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x19d845);
  this_00 = in_RDI + 0x40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19d858);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,(size_type)in_RDI);
    local_30 = 0;
    while( true ) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
      if (sVar3 <= local_30) break;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_RDX,local_30);
      vVar1 = *pvVar4;
      pcVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                         ((vector<signed_char,_std::allocator<signed_char>_> *)0x19d930);
      pcVar5[local_30] = vVar1;
      local_30 = local_30 + 1;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0x8c,
             "GGML_ASSERT(%s) failed","!key.empty()");
}

Assistant:

gguf_kv(const std::string & key, const std::vector<T> & value)
            : key(key), is_array(true), type(type_to_gguf_type<T>::value) {
        GGML_ASSERT(!key.empty());
        data.resize(value.size()*sizeof(T));
        for (size_t i = 0; i < value.size(); ++i) {
            const T tmp = value[i];
            memcpy(data.data() + i*sizeof(T), &tmp, sizeof(T));
        }
    }